

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool QApplicationPrivate::sendMouseEvent
               (QWidget *receiver,QMouseEvent *event,QWidget *alienWidget,QWidget *nativeWidget,
               QWidget **buttonDown,QPointer<QWidget> *lastMouseReceiver,bool spontaneous,
               bool onlyDispatchEnterLeave)

{
  Data *pDVar1;
  QObject *pQVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  undefined1 uVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  QWidget *pQVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QPointF QVar11;
  QPoint local_a8;
  qreal local_a0;
  QPointF local_98;
  double local_88;
  double local_80;
  QWeakPointer<QObject> local_78;
  QWeakPointer<QObject> local_68;
  QWeakPointer<QObject> local_58;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (alienWidget == (QWidget *)0x0) {
    pQVar9 = (QWidget *)0x0;
  }
  else {
    pQVar9 = (QWidget *)0x0;
    if (((alienWidget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      pQVar9 = alienWidget;
    }
  }
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_48,receiver);
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_58,nativeWidget);
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_68,pQVar9);
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = QApplication::activePopupWidget();
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_78,pQVar7);
  bVar3 = QWidget::testAttribute_helper(nativeWidget,WA_DontShowOnScreen);
  QVar10 = QWidget::rect(receiver);
  local_98.xp = (qreal)QVar10.x1.m_i.m_i;
  local_98.yp = (qreal)QVar10.y1.m_i.m_i;
  local_88 = (double)(((long)QVar10.x2.m_i.m_i - (long)QVar10.x1.m_i.m_i) + 1);
  local_80 = (double)(((QVar10._8_8_ >> 0x20) - (QVar10._0_8_ >> 0x20)) + 1);
  QVar11 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_a0 = QVar11.yp;
  local_a8 = (QPoint)QVar11.xp;
  bVar4 = QRectF::contains(&local_98);
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)&leaveAfterRelease);
  pQVar7 = *buttonDown;
  if (bVar5) {
    if (pQVar7 == (QWidget *)0x0) {
      if (*(int *)(event + 0x44) == 0) {
        QWeakPointer<QObject>::assign<QObject>(&leaveAfterRelease.wp,(QObject *)0x0);
        pQVar7 = *buttonDown;
        goto LAB_002be8e6;
      }
      goto LAB_002be924;
    }
LAB_002be8eb:
    if (!bVar3) {
      if ((((pQVar9 != (QWidget *)0x0) || (receiver->data->winid == 0)) &&
          (bVar5 = QPointer::operator_cast_to_bool((QPointer *)&leaveAfterRelease), !bVar5)) &&
         (pQVar7 = QWidget::mouseGrabber(), pQVar7 == (QWidget *)0x0)) {
        QWeakPointer<QObject>::assign<QObject>(&leaveAfterRelease.wp,&(*buttonDown)->super_QObject);
      }
      if ((*(short *)(event + 8) == 3) && (*(int *)(event + 0x44) == 0)) {
        *buttonDown = (QWidget *)0x0;
      }
    }
  }
  else {
LAB_002be8e6:
    if (pQVar7 != (QWidget *)0x0) goto LAB_002be8eb;
LAB_002be924:
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)lastMouseReceiver);
    if ((bVar4 & bVar5) == 1) {
      pDVar1 = (lastMouseReceiver->wp).d;
      if (pQVar9 == (QWidget *)0x0) {
LAB_002be9da:
        if ((((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
            (pQVar2 = (lastMouseReceiver->wp).value, pQVar2 == (QObject *)0x0)) ||
           ((pQVar9 != (QWidget *)0x0 || ((*(uint *)(*(long *)(pQVar2 + 0x20) + 0xc) & 1) != 0))))
        goto LAB_002bea6f;
      }
      else {
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar7 = (QWidget *)0x0;
        }
        else {
          pQVar7 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        if (pQVar7 == pQVar9) goto LAB_002be9da;
      }
      bVar5 = QPointer::operator_cast_to_bool((QPointer *)&local_78);
      if (bVar5) {
        pQVar7 = QWidget::mouseGrabber();
        if (pQVar7 != (QWidget *)0x0) goto LAB_002bea6f;
        pQVar8 = pQVar9;
        if (pQVar9 == (QWidget *)0x0) {
          pQVar8 = nativeWidget;
        }
        pDVar1 = (lastMouseReceiver->wp).d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar7 = (QWidget *)0x0;
        }
        else {
          pQVar7 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        QVar11 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
        local_98.yp = QVar11.yp;
        local_98.xp = QVar11.xp;
      }
      else {
        pDVar1 = (lastMouseReceiver->wp).d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar7 = (QWidget *)0x0;
        }
        else {
          pQVar7 = (QWidget *)(lastMouseReceiver->wp).value;
        }
        QVar11 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
        local_98.yp = QVar11.yp;
        local_98.xp = QVar11.xp;
        pQVar8 = receiver;
      }
      dispatchEnterLeave(pQVar8,pQVar7,&local_98);
    }
  }
LAB_002bea6f:
  bVar5 = QWeakPointer<QObject>::isNull(&leaveAfterRelease.wp);
  uVar6 = 1;
  if (!onlyDispatchEnterLeave) {
    if (spontaneous) {
      uVar6 = QCoreApplication::sendSpontaneousEvent(&receiver->super_QObject,(QEvent *)event);
    }
    else {
      uVar6 = QCoreApplication::sendEvent(&receiver->super_QObject,(QEvent *)event);
    }
  }
  if (((bVar3) || (bVar3 = QPointer::operator_cast_to_bool((QPointer *)&leaveAfterRelease), !bVar3))
     || ((*(short *)(event + 8) != 3 || (*(int *)(event + 0x44) != 0)))) {
LAB_002bead3:
    if (!bVar5) goto LAB_002bec3a;
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_78);
    if (bVar3) {
      pQVar7 = QWidget::mouseGrabber();
      if (pQVar7 != (QWidget *)0x0) goto LAB_002bec3a;
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
      receiver = pQVar9;
      if (!bVar3) {
        bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
        receiver = (QWidget *)0x0;
        if (bVar3) {
          receiver = nativeWidget;
        }
      }
    }
    else {
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_48);
      if (!bVar3) {
        QVar11 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
        local_98.yp = QVar11.yp;
        local_98.xp = QVar11.xp;
        local_a8 = QPointF::toPoint(&local_98);
        receiver = QApplication::widgetAt(&local_a8);
      }
    }
  }
  else {
    pQVar7 = QWidget::mouseGrabber();
    if ((leaveAfterRelease.wp.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)leaveAfterRelease.wp.value, *(int *)(leaveAfterRelease.wp.d + 4) == 0))
    {
      pQVar8 = (QWidget *)0x0;
    }
    if (pQVar8 == pQVar7) goto LAB_002bead3;
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_58);
    if (bVar3) {
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
      receiver = nativeWidget;
      if (bVar3) {
        receiver = pQVar9;
      }
    }
    else {
      QVar11 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      local_98.yp = QVar11.yp;
      local_98.xp = QVar11.xp;
      local_a8 = QPointF::toPoint(&local_98);
      receiver = QApplication::widgetAt(&local_a8);
    }
    if ((leaveAfterRelease.wp.d == (Data *)0x0) ||
       (pQVar9 = (QWidget *)leaveAfterRelease.wp.value, *(int *)(leaveAfterRelease.wp.d + 4) == 0))
    {
      pQVar9 = (QWidget *)0x0;
    }
    QVar11 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    local_98.yp = QVar11.yp;
    local_98.xp = QVar11.xp;
    dispatchEnterLeave(receiver,pQVar9,&local_98);
    QWeakPointer<QObject>::assign<QObject>(&leaveAfterRelease.wp,(QObject *)0x0);
  }
  QWeakPointer<QObject>::assign<QObject>(&lastMouseReceiver->wp,&receiver->super_QObject);
LAB_002bec3a:
  QWeakPointer<QObject>::~QWeakPointer(&local_78);
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
  QWeakPointer<QObject>::~QWeakPointer(&local_58);
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar6;
}

Assistant:

bool QApplicationPrivate::sendMouseEvent(QWidget *receiver, QMouseEvent *event,
                                         QWidget *alienWidget, QWidget *nativeWidget,
                                         QWidget **buttonDown, QPointer<QWidget> &lastMouseReceiver,
                                         bool spontaneous, bool onlyDispatchEnterLeave)
{
    Q_ASSERT(receiver);
    Q_ASSERT(event);
    Q_ASSERT(nativeWidget);
    Q_ASSERT(buttonDown);

    if (alienWidget && !isAlien(alienWidget))
        alienWidget = nullptr;

    QPointer<QWidget> receiverGuard = receiver;
    QPointer<QWidget> nativeGuard = nativeWidget;
    QPointer<QWidget> alienGuard = alienWidget;
    QPointer<QWidget> activePopupWidget = QApplication::activePopupWidget();

    const bool graphicsWidget = nativeWidget->testAttribute(Qt::WA_DontShowOnScreen);

    bool widgetUnderMouse = QRectF(receiver->rect()).contains(event->position());

    // Clear the obsolete leaveAfterRelease value, if mouse button has been released but
    // leaveAfterRelease has not been updated.
    // This happens e.g. when modal dialog or popup is shown as a response to button click.
    if (leaveAfterRelease && !*buttonDown && !event->buttons())
        leaveAfterRelease = nullptr;

    if (*buttonDown) {
        if (!graphicsWidget) {
            // Register the widget that shall receive a leave event
            // after the last button is released.
            if ((alienWidget || !receiver->internalWinId()) && !leaveAfterRelease && !QWidget::mouseGrabber())
                leaveAfterRelease = *buttonDown;
            if (event->type() == QEvent::MouseButtonRelease && !event->buttons())
                *buttonDown = nullptr;
        }
    } else if (lastMouseReceiver && widgetUnderMouse) {
        // Dispatch enter/leave if we move:
        // 1) from an alien widget to another alien widget or
        //    from a native widget to an alien widget (first OR case)
        // 2) from an alien widget to a native widget (second OR case)
        if ((alienWidget && alienWidget != lastMouseReceiver)
            || (isAlien(lastMouseReceiver) && !alienWidget)) {
            if (activePopupWidget) {
                if (!QWidget::mouseGrabber())
                    dispatchEnterLeave(alienWidget ? alienWidget : nativeWidget, lastMouseReceiver, event->globalPosition());
            } else {
                dispatchEnterLeave(receiver, lastMouseReceiver, event->globalPosition());
            }

        }
    }

    // We need this quard in case someone opens a modal dialog / popup. If that's the case
    // leaveAfterRelease is set to null, but we shall not update lastMouseReceiver.
    const bool wasLeaveAfterRelease = leaveAfterRelease != nullptr;
    bool result = true;
    // This code is used for sending the synthetic enter/leave events for cases where it is needed
    // due to other events causing the widget under the mouse to change. However in those cases
    // we do not want to send the mouse event associated with this call, so this enables us to
    // not send the unneeded mouse event
    if (!onlyDispatchEnterLeave) {
        if (spontaneous)
            result = QApplication::sendSpontaneousEvent(receiver, event);
        else
            result = QCoreApplication::sendEvent(receiver, event);
    }

    if (!graphicsWidget && leaveAfterRelease && event->type() == QEvent::MouseButtonRelease
        && !event->buttons() && QWidget::mouseGrabber() != leaveAfterRelease) {
        // Dispatch enter/leave if:
        // 1) the mouse grabber is an alien widget
        // 2) the button is released on an alien widget
        QWidget *enter = nullptr;
        if (nativeGuard)
            enter = alienGuard ? alienWidget : nativeWidget;
        else // The receiver is typically deleted on mouse release with drag'n'drop.
            enter = QApplication::widgetAt(event->globalPosition().toPoint());
        dispatchEnterLeave(enter, leaveAfterRelease, event->globalPosition());
        leaveAfterRelease = nullptr;
        lastMouseReceiver = enter;
    } else if (!wasLeaveAfterRelease) {
        if (activePopupWidget) {
            if (!QWidget::mouseGrabber())
                lastMouseReceiver = alienGuard ? alienWidget : (nativeGuard ? nativeWidget : nullptr);
        } else {
            lastMouseReceiver = receiverGuard ? receiver : QApplication::widgetAt(event->globalPosition().toPoint());
        }
    }

    return result;
}